

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O3

RuleBuilder * __thiscall Potassco::RuleBuilder::startMinimize(RuleBuilder *this,Weight_t prio)

{
  uint *puVar1;
  uint uVar2;
  Weight_t *pWVar3;
  uint32_t t;
  uint uVar4;
  uint *puVar5;
  
  puVar5 = (uint *)(this->mem_).beg_;
  uVar4 = *puVar5;
  puVar1 = puVar5 + 1;
  if ((int)uVar4 < 0) {
    puVar1[0] = 0;
    puVar1[1] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    *puVar5 = 0x14;
    uVar4 = 0x14;
  }
  else if ((*puVar1 & 0x3fffffff) != 0) goto LAB_00117f9c;
  if ((puVar5[3] & 0x3fffffff) == 0) {
    puVar5[2] = uVar4;
    puVar5[1] = uVar4 & 0x3fffffff | 0x80000000;
    uVar2 = uVar4 + 4;
    if ((ulong)((long)(this->mem_).end_ - (long)(this->mem_).beg_) < (ulong)uVar2) {
      MemoryRegion::grow(&this->mem_,(ulong)uVar2);
      puVar5 = (uint *)(this->mem_).beg_;
    }
    pWVar3 = (Weight_t *)MemoryRegion::operator[](&this->mem_,(ulong)uVar4);
    *pWVar3 = prio;
    *puVar5 = *puVar5 & 0x80000000 | uVar2 & 0x7fffffff;
    puVar5[4] = uVar2 & 0x7fffffff;
    puVar5[3] = uVar2 & 0x3fffffff | 0x40000000;
    return this;
  }
LAB_00117f9c:
  fail(-1,"RuleBuilder &Potassco::RuleBuilder::startMinimize(Weight_t)",0x98,
       "!r->head.mbeg && !r->body.mbeg","Invalid call to startMinimize()",0);
}

Assistant:

RuleBuilder& RuleBuilder::startMinimize(Weight_t prio) {
	Rule* r = unfreeze(true);
	POTASSCO_ASSERT(!r->head.mbeg && !r->body.mbeg, "Invalid call to startMinimize()");
	r->head.init(r->top, Directive_t::Minimize);
	r = push(mem_, r, prio);
	r->body.init(r->top, Body_t::Sum);
	return *this;
}